

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

void Lf_ManComputeSwitching(Gia_Man_t *p,Vec_Flt_t *vSwitches)

{
  int iVar1;
  Vec_Int_t *__ptr;
  Vec_Flt_t *vSwitching;
  Vec_Flt_t *vSwitches_local;
  Gia_Man_t *p_local;
  
  __ptr = Gia_ManComputeSwitchProbs(p,0x30,0x10,0);
  iVar1 = Vec_FltCap(vSwitches);
  if (iVar1 != 0) {
    __assert_fail("Vec_FltCap(vSwitches) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaLf.c"
                  ,0x151,"void Lf_ManComputeSwitching(Gia_Man_t *, Vec_Flt_t *)");
  }
  iVar1 = __ptr->nSize;
  vSwitches->nCap = __ptr->nCap;
  vSwitches->nSize = iVar1;
  vSwitches->pArray = (float *)__ptr->pArray;
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Lf_ManComputeSwitching( Gia_Man_t * p, Vec_Flt_t * vSwitches )
{
//    abctime clk = Abc_Clock();
    Vec_Flt_t * vSwitching = (Vec_Flt_t *)Gia_ManComputeSwitchProbs( p, 48, 16, 0 );
    assert( Vec_FltCap(vSwitches) == 0 );
    *vSwitches = *vSwitching;
    ABC_FREE( vSwitching );
//    Abc_PrintTime( 1, "Computing switching activity", Abc_Clock() - clk );
}